

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O1

void xray_re::xr_file_system::split_path(char *path,string *folder,string *name,string *extension)

{
  undefined1 auVar1 [16];
  CPath p;
  string_type local_b8;
  path local_98;
  long *local_70 [2];
  long local_60 [2];
  path local_50;
  
  local_98._M_pathname._M_dataplus._M_p = path;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_50,(char **)&local_98,auto_format);
  if (folder != (string *)0x0) {
    std::filesystem::__cxx11::path::parent_path();
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_98._M_pathname._M_dataplus._M_p,
               local_98._M_pathname._M_dataplus._M_p + local_98._M_pathname._M_string_length);
    std::__cxx11::string::operator=((string *)folder,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_98);
  }
  if (name != (string *)0x0) {
    auVar1 = std::filesystem::__cxx11::path::_M_find_extension();
    if (auVar1._8_8_ == 0 || auVar1._0_8_ == 0) {
      std::filesystem::__cxx11::path::path(&local_98);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_b8,auVar1._0_8_);
      std::filesystem::__cxx11::path::path(&local_98,&local_b8,auto_format);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,local_98._M_pathname._M_dataplus._M_p,
               local_98._M_pathname._M_dataplus._M_p + local_98._M_pathname._M_string_length);
    std::__cxx11::string::operator=((string *)name,(string *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_98);
  }
  if (extension != (string *)0x0) {
    auVar1 = std::filesystem::__cxx11::path::_M_find_extension();
    if (auVar1._8_8_ == -1 || auVar1._0_8_ == 0) {
      std::filesystem::__cxx11::path::path(&local_98);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_b8,auVar1._0_8_);
      std::filesystem::__cxx11::path::path(&local_98,&local_b8,auto_format);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,local_98._M_pathname._M_dataplus._M_p,
               local_98._M_pathname._M_dataplus._M_p + local_98._M_pathname._M_string_length);
    std::__cxx11::string::operator=((string *)extension,(string *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_98);
  }
  std::filesystem::__cxx11::path::~path(&local_50);
  return;
}

Assistant:

void xr_file_system::split_path(const char* path, std::string* folder, std::string* name, std::string* extension)
{
CPath p(path);

	if(folder != nullptr)
		folder->assign(p.parent_path());

	if(name != nullptr)
		name->assign(p.stem());

	if(extension != nullptr)
		extension->assign(p.extension());
}